

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx_batch.c
# Opt level: O1

int write_ctm(FILE *fh,ps_decoder_t *ps,ps_seg_t *itor,char *uttid,int32 frate)

{
  dictword_t *pdVar1;
  uint w;
  int iVar2;
  int32 logb_p;
  int extraout_EAX;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  float64 fVar6;
  int32 ef;
  int32 sf;
  int local_68;
  int local_64;
  double local_60;
  double local_58;
  logmath_t *local_50;
  FILE *local_48;
  double local_40;
  double local_38;
  
  local_48 = (FILE *)fh;
  local_50 = ps_get_logmath(ps);
  pcVar3 = "(null)";
  if (uttid != (char *)0x0) {
    pcVar3 = uttid;
  }
  pcVar3 = __ckd_salloc__(pcVar3,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                          ,0x25e);
  pcVar4 = strchr(pcVar3,0x2c);
  local_60 = 0.0;
  if (pcVar4 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    pcVar5 = pcVar4 + 1;
    *pcVar4 = '\0';
    pcVar4 = strchr(pcVar5,0x2c);
    if (pcVar4 != (char *)0x0) {
      *pcVar4 = '\0';
      pcVar4 = strchr(pcVar4 + 1,0x2c);
      if (pcVar4 != (char *)0x0) {
        local_60 = atof_c(pcVar4 + 1);
      }
    }
  }
  if (itor != (ps_seg_t *)0x0) {
    pcVar4 = "1";
    if (pcVar5 != (char *)0x0) {
      pcVar4 = pcVar5;
    }
    local_58 = (double)frate;
    do {
      pcVar5 = ps_seg_word(itor);
      w = dict_wordid(ps->dict,pcVar5);
      if (-1 < (int)w) {
        iVar2 = dict_real_word(ps->dict,w);
        if (iVar2 != 0) {
          logb_p = ps_seg_prob(itor,(int32 *)0x0,(int32 *)0x0,(int32 *)0x0);
          ps_seg_frames(itor,&local_64,&local_68);
          local_38 = (double)local_64 / local_58 + local_60;
          local_40 = (double)(local_68 - local_64) / local_58;
          pdVar1 = ps->dict->word;
          pcVar5 = pdVar1[pdVar1[w].basewid].word;
          fVar6 = logmath_exp(local_50,logb_p);
          fprintf(local_48,"%s %s %.2f %.2f %s %.3f\n",local_38,local_40,fVar6,pcVar3,pcVar4,pcVar5)
          ;
        }
      }
      itor = ps_seg_next(itor);
    } while (itor != (ps_seg_t *)0x0);
  }
  ckd_free(pcVar3);
  return extraout_EAX;
}

Assistant:

static int
write_ctm(FILE *fh, ps_decoder_t *ps, ps_seg_t *itor, char const *uttid, int32 frate)
{
    logmath_t *lmath = ps_get_logmath(ps);
    char *dupid, *show, *channel, *c;
    double ustart = 0.0;

    /* We have semi-standardized on comma-separated uttids which
     * correspond to the fields of the STM file.  So if there's a
     * comma in the uttid, take the first two fields as show and
     * channel, and also try to find the start time. */
    show = dupid = ckd_salloc(uttid ? uttid : "(null)");
    if ((c = strchr(dupid, ',')) != NULL) {
        *c++ = '\0';
        channel = c;
        if ((c = strchr(c, ',')) != NULL) {
            *c++ = '\0';
            if ((c = strchr(c, ',')) != NULL) {
                ustart = atof_c(c + 1);
            }
        }
    }
    else {
        channel = NULL;
    }

    while (itor) {
        int32 prob, sf, ef, wid;
        char const *w;

        /* Skip things that aren't "real words" (FIXME: currently
         * requires s3kr3t h34d3rz...) */
        w = ps_seg_word(itor);
        wid = dict_wordid(ps->dict, w);
        if (wid >= 0 && dict_real_word(ps->dict, wid)) {
            prob = ps_seg_prob(itor, NULL, NULL, NULL);
            ps_seg_frames(itor, &sf, &ef);
        
            fprintf(fh, "%s %s %.2f %.2f %s %.3f\n",
                    show,
                    channel ? channel : "1",
                    ustart + (double)sf / frate,
                    (double)(ef - sf) / frate,
                    /* FIXME: More s3kr3tz */
                    dict_basestr(ps->dict, wid),
                    logmath_exp(lmath, prob));
        }
        itor = ps_seg_next(itor);
    }
    ckd_free(dupid);

    return 0;
}